

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

size_t mwFreeUp(size_t needed,int urgent)

{
  mwData *mw;
  uint uVar1;
  void *pvVar2;
  mwData **ppmVar3;
  mwData *pmVar4;
  
  uVar1 = mwDrop_(1,0xfc,1);
  if (uVar1 == 0) {
    ppmVar3 = &mwHead;
    while (mw = *ppmVar3, mw != (mwData *)0x0) {
      if ((mw->flag & 1) != 0) {
        pmVar4 = mw + 1;
        if (mwDataSize == '\0') {
          pmVar4 = mw;
        }
        pvVar2 = mwTestMem(&pmVar4->next,(uint)mw->size,0xfc);
        if (pvVar2 != (void *)0x0) {
          mwIncErr();
          mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",mw->count,&pmVar4->file,
                  mw->file,(ulong)(uint)mw->line);
        }
        mwUnlink(mw,"mwFreeUp",0);
        free(mw);
        return needed;
      }
      ppmVar3 = &mw->next;
    }
    needed = 0;
  }
  return needed;
}

Assistant:

static size_t mwFreeUp(size_t needed, int urgent)
{
	void *p;
	mwData *mw, *mw2;
	char *data;

	/* free grabbed NML memory */
	for (;;) {
		if (mwDrop_(1, MW_VAL_NML, 1) == 0) {
			break;
		}
		p = malloc(needed);
		if (p == NULL) {
			continue;
		}
		free(p);
		return needed;
	}

	/* free normal NML memory */
	mw = mwHead;
	while (mw != NULL) {
		if (!(mw->flag & MW_NML)) {
			mw = mw->next;
		} else {
			data = ((char *)mw) + mwDataSize + mwOverflowZoneSize;
			if (mwTestMem(data, mw->size, MW_VAL_NML)) {
				mwIncErr();
				mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
						mw->count, data + mwOverflowZoneSize, mw->file, mw->line);
			}
			mw2 = mw->next;
			mwUnlink(mw, "mwFreeUp", 0);
			free(mw);
			mw = mw2;
			p = malloc(needed);
			if (p == NULL) {
				continue;
			}
			free(p);
			return needed;
		}
	}

	/* if not urgent (for internal purposes), fail */
	if (!urgent) {
		return 0;
	}

	/* free grabbed memory */
	for (;;) {
		if (mwDrop_(1, MW_VAL_GRB, 1) == 0) {
			break;
		}
		p = malloc(needed);
		if (p == NULL) {
			continue;
		}
		free(p);
		return needed;
	}

	return 0;
}